

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O0

Aig_Man_t * Inter_ManFramesLatches(Aig_Man_t *pAig,int nFrames,Vec_Ptr_t **pvMapReg)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  Aig_Obj_t *p1;
  int local_48;
  int local_44;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  Vec_Ptr_t **pvMapReg_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Saig_ManRegNum(pAig);
  if (iVar1 < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intContain.c"
                  ,0x74,"Aig_Man_t *Inter_ManFramesLatches(Aig_Man_t *, int, Vec_Ptr_t **)");
  }
  iVar1 = Aig_ManNodeNum(pAig);
  p = Aig_ManStart(iVar1 * nFrames);
  pAVar2 = Aig_ManConst1(p);
  pAVar3 = Aig_ManConst1(pAig);
  (pAVar3->field_5).pData = pAVar2;
  iVar1 = Saig_ManRegNum(pAig);
  pVVar4 = Vec_PtrAlloc((nFrames + 1) * iVar1);
  *pvMapReg = pVVar4;
  for (local_44 = 0; iVar1 = Saig_ManRegNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
    pVVar4 = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pvVar5 = Vec_PtrEntry(pVVar4,local_44 + iVar1);
    pAVar2 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar2;
    Vec_PtrPush(*pvMapReg,*(void **)((long)pvVar5 + 0x28));
  }
  for (local_48 = 0; local_48 < nFrames; local_48 = local_48 + 1) {
    for (local_44 = 0; iVar1 = Saig_ManPiNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCis,local_44);
      pAVar2 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar2;
    }
    for (local_44 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_44 < iVar1; local_44 = local_44 + 1)
    {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_44);
      if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) {
        pAVar3 = Aig_ObjChild0Copy(pAVar2);
        p1 = Aig_ObjChild1Copy(pAVar2);
        pAVar3 = Aig_And(p,pAVar3,p1);
        (pAVar2->field_5).pData = pAVar3;
      }
    }
    for (local_44 = 0; iVar1 = Saig_ManRegNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
      pVVar4 = pAig->vCos;
      iVar1 = Saig_ManPoNum(pAig);
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pVVar4,local_44 + iVar1);
      pAVar3 = Aig_ObjChild0Copy(pAVar2);
      (pAVar2->field_5).pData = pAVar3;
    }
    for (local_44 = 0; iVar1 = Saig_ManRegNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
      pAVar2 = Saig_ManLi(pAig,local_44);
      pAVar3 = Saig_ManLo(pAig,local_44);
      pAVar3->field_5 = pAVar2->field_5;
      Vec_PtrPush(*pvMapReg,(pAVar3->field_5).pData);
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Inter_ManFramesLatches( Aig_Man_t * pAig, int nFrames, Vec_Ptr_t ** pvMapReg )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    *pvMapReg = Vec_PtrAlloc( (nFrames+1) * Saig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pFrames );
        Vec_PtrPush( *pvMapReg, pObj->pData );
    }
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
        {
            pObjLo->pData = pObjLi->pData;
            Vec_PtrPush( *pvMapReg, pObjLo->pData );
        }
    }
    return pFrames;
}